

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O1

void fm_quatRotate(float *quat,float *v,float *r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  fVar1 = quat[3];
  fVar2 = *quat;
  fVar3 = quat[1];
  fVar4 = *v;
  fVar5 = v[1];
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * v[2])),ZEXT416((uint)fVar1),ZEXT416((uint)fVar4));
  fVar6 = quat[2];
  auVar8 = vfnmadd231ss_fma(auVar7,ZEXT416((uint)fVar5),ZEXT416((uint)fVar6));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar6)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar5))
  ;
  auVar11 = ZEXT416((uint)v[2]);
  auVar9 = vfnmadd231ss_fma(auVar7,auVar11,ZEXT416((uint)fVar2));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar2)),ZEXT416((uint)fVar1),auVar11);
  auVar10 = vfnmadd231ss_fma(auVar7,ZEXT416((uint)fVar4),ZEXT416((uint)fVar3));
  auVar7 = vfnmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar3)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar4)
                           );
  auVar11 = vfnmadd231ss_fma(auVar7,ZEXT416((uint)fVar6),auVar11);
  auVar7 = vfnmadd231ss_fma(ZEXT416((uint)(fVar1 * auVar8._0_4_)),auVar11,ZEXT416((uint)fVar2));
  auVar7 = vfnmadd231ss_fma(auVar7,auVar9,ZEXT416((uint)fVar6));
  auVar7 = vfmadd231ss_fma(auVar7,auVar10,ZEXT416((uint)fVar3));
  *r = auVar7._0_4_;
  auVar7 = vfnmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * quat[3])),auVar11,ZEXT416((uint)quat[1]));
  auVar7 = vfnmadd231ss_fma(auVar7,auVar10,ZEXT416((uint)*quat));
  auVar7 = vfmadd231ss_fma(auVar7,auVar8,ZEXT416((uint)quat[2]));
  r[1] = auVar7._0_4_;
  auVar7 = vfnmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * quat[3])),auVar11,ZEXT416((uint)quat[2]))
  ;
  auVar7 = vfnmadd231ss_fma(auVar7,auVar8,ZEXT416((uint)quat[1]));
  auVar7 = vfmadd231ss_fma(auVar7,auVar9,ZEXT416((uint)*quat));
  r[2] = auVar7._0_4_;
  return;
}

Assistant:

void fm_quatRotate(const float *quat,const float *v,float *r) // rotate a vector directly by a quaternion.
{
  float left[4];

	left[0] =   quat[3]*v[0] + quat[1]*v[2] - v[1]*quat[2];
	left[1] =   quat[3]*v[1] + quat[2]*v[0] - v[2]*quat[0];
	left[2] =   quat[3]*v[2] + quat[0]*v[1] - v[0]*quat[1];
	left[3] = - quat[0]*v[0] - quat[1]*v[1] - quat[2]*v[2];

	r[0] = (left[3]*-quat[0]) + (quat[3]*left[0]) + (left[1]*-quat[2]) - (-quat[1]*left[2]);
	r[1] = (left[3]*-quat[1]) + (quat[3]*left[1]) + (left[2]*-quat[0]) - (-quat[2]*left[0]);
	r[2] = (left[3]*-quat[2]) + (quat[3]*left[2]) + (left[0]*-quat[1]) - (-quat[0]*left[1]);

}